

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O0

Violation mp::
          ComputeViolation<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::NumberofVarId,mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                    (CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofVarId>
                     *c,VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  Violation VVar1;
  bool bVar2;
  CtxVal CVar3;
  double *pdVar4;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_RSI;
  FunctionalConstraint *in_RDI;
  double dVar5;
  double dVar6;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *this;
  double viol;
  int resvar;
  undefined8 in_stack_ffffffffffffff98;
  int iVar7;
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffb8;
  int i;
  undefined4 in_stack_ffffffffffffffc8;
  Context in_stack_ffffffffffffffcc;
  NumberofVarConstraint *in_stack_ffffffffffffffd0;
  double local_10;
  double local_8;
  
  i = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  FunctionalConstraint::GetResultVar(in_RDI);
  bVar2 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::recomp_vals(in_RSI);
  iVar7 = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (bVar2) {
    dVar5 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                      (in_stack_ffffffffffffffa0,iVar7);
    iVar7 = (int)((ulong)dVar5 >> 0x20);
    dVar6 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::raw
                      (in_stack_ffffffffffffffa0,iVar7);
    this = (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)ABS(dVar5 - dVar6);
    VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::bounds_viol
              ((VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)0x0,i);
    pdVar4 = std::max<double>((double *)&stack0xffffffffffffffc0,(double *)&stack0xffffffffffffffb8)
    ;
    local_10 = (double)this + *pdVar4;
    local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[](this,iVar7);
  }
  else {
    local_10 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                         (in_stack_ffffffffffffffa0,iVar7);
    dVar5 = ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
                      (in_stack_ffffffffffffffd0,
                       (VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *)
                       CONCAT44(in_stack_ffffffffffffffcc.value_,in_stack_ffffffffffffffc8));
    local_10 = local_10 - dVar5;
    FunctionalConstraint::GetContext(in_RDI);
    CVar3 = Context::GetValue((Context *)&stack0xffffffffffffffcc);
    if (CVar3 == CTX_POS) {
      local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                          (in_stack_ffffffffffffffa0,iVar7);
    }
    else if (CVar3 == CTX_NEG) {
      local_10 = -local_10;
      local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                          (in_stack_ffffffffffffffa0,iVar7);
    }
    else if (CVar3 == CTX_MIX) {
      local_10 = ABS(local_10);
      local_8 = VarInfoImpl<std::vector<double,_std::allocator<double>_>_>::operator[]
                          (in_stack_ffffffffffffffa0,iVar7);
    }
    else {
      local_10 = INFINITY;
      local_8 = 0.0;
    }
  }
  VVar1.valX_ = local_8;
  VVar1.viol_ = local_10;
  return VVar1;
}

Assistant:

Violation ComputeViolation(
    const CustomFunctionalConstraint<Args, Params, NumOrLogic, Id>& c,
    const VarVec& x) {
  auto resvar = c.GetResultVar();
  if (!x.recomp_vals()) {    // solver's var values: normal check
    auto viol = x[resvar] - ComputeValue(c, x);
    switch (c.GetContext().GetValue()) {
    case Context::CTX_MIX:
      return {std::fabs(viol), x[resvar]};
    case Context::CTX_POS:
      return {viol, x[resvar]};
    case Context::CTX_NEG:
      return {-viol, x[resvar]};
    default:
      return {INFINITY, 0.0};
    }
  }
  return                              // recomputed var minus solver's
  { std::fabs(x[resvar] - x.raw(resvar))
        + std::max(0.0, x.bounds_viol(resvar)), x[resvar]};
}